

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_llc_u_subtype(compiler_state_t *cstate,bpf_u_int32 subtype)

{
  block *b0_00;
  block *b1_00;
  block *b1;
  block *b0;
  bpf_u_int32 subtype_local;
  compiler_state_t *cstate_local;
  
  b0_00 = gen_llc(cstate);
  b1_00 = gen_mcmp(cstate,OR_LLC,2,0x10,subtype,0xef);
  gen_and(b0_00,b1_00);
  return b1_00;
}

Assistant:

struct block *
gen_llc_u_subtype(compiler_state_t *cstate, bpf_u_int32 subtype)
{
	struct block *b0, *b1;

	/*
	 * Check whether this is an LLC frame.
	 */
	b0 = gen_llc(cstate);

	/*
	 * Now check for a U frame with the appropriate type.
	 */
	b1 = gen_mcmp(cstate, OR_LLC, 2, BPF_B, subtype, LLC_U_CMD_MASK);
	gen_and(b0, b1);
	return b1;
}